

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

void __thiscall
DnsStats::SubmitOPTRecord
          (DnsStats *this,uint32_t flags,uint8_t *content,uint32_t length,uint32_t *e_rcode)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t *puVar3;
  uint uVar4;
  
  RegisterEdnsUsage(this,flags,e_rcode);
  uVar4 = 0;
  puVar3 = (uint8_t *)0x0;
  if (length != 0) {
    puVar3 = content;
  }
  this->edns_options = puVar3;
  this->edns_options_length = length;
  for (; uVar4 + 4 <= length; uVar4 = uVar4 + 4 + (uint)CONCAT11(uVar1,uVar2)) {
    uVar1 = content[uVar4 + 2];
    uVar2 = content[uVar4 + 3];
    SubmitRegistryNumber(this,8,(uint)CONCAT11(content[uVar4],content[uVar4 + 1]));
  }
  return;
}

Assistant:

void DnsStats::SubmitOPTRecord(uint32_t flags, uint8_t * content, uint32_t length, uint32_t * e_rcode)
{
    uint32_t current_index = 0;

    RegisterEdnsUsage(flags, e_rcode);

    if (current_index < length) {
        edns_options = &content[current_index];
        edns_options_length = length - current_index;
    }
    else {
        edns_options = NULL;
        edns_options_length = 0;
    }

    /* Find the options in the payload */
    while (current_index + 4 <= length)
    {
        uint32_t o_code = (content[current_index] << 8) | content[current_index + 1];
        uint32_t o_length = (content[current_index+2] << 8) | content[current_index + 3];
        current_index += 4 + o_length;
        SubmitRegistryNumber(REGISTRY_EDNS_OPT_CODE, o_code);
    }
}